

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_run_container_lazy_xor
               (array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  uint16_t start;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = 0;
  run_container_grow(dst,src_2->n_runs + src_1->cardinality,false);
  dst->n_runs = 0;
  lVar3 = 0;
  do {
    uVar2 = (ulong)uVar1;
    lVar3 = (long)(int)lVar3;
    while( true ) {
      if ((src_2->n_runs <= (int)uVar1) || (src_1->cardinality <= (int)lVar3)) {
        for (; lVar3 < src_1->cardinality; lVar3 = lVar3 + 1) {
          run_container_smart_append_exclusive(dst,src_1->array[lVar3],0);
        }
        for (; (long)uVar2 < (long)src_2->n_runs; uVar2 = uVar2 + 1) {
          run_container_smart_append_exclusive
                    (dst,src_2->runs[uVar2].value,src_2->runs[uVar2].length);
        }
        return;
      }
      start = src_2->runs[uVar2].value;
      if (start <= src_1->array[lVar3]) break;
      run_container_smart_append_exclusive(dst,src_1->array[lVar3],0);
      lVar3 = lVar3 + 1;
    }
    run_container_smart_append_exclusive(dst,start,src_2->runs[uVar2].length);
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void array_run_container_lazy_xor(const array_container_t *src_1,
                                  const run_container_t *src_2,
                                  run_container_t *dst) {
    run_container_grow(dst, src_1->cardinality + src_2->n_runs, false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    dst->n_runs = 0;

    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                                 src_2->runs[rlepos].length);
            rlepos++;
        } else {
            run_container_smart_append_exclusive(dst, src_1->array[arraypos],
                                                 0);
            arraypos++;
        }
    }
    while (arraypos < src_1->cardinality) {
        run_container_smart_append_exclusive(dst, src_1->array[arraypos], 0);
        arraypos++;
    }
    while (rlepos < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                             src_2->runs[rlepos].length);
        rlepos++;
    }
}